

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O3

void log_vprintf(ly_ctx *ctx,LY_LOG_LEVEL level,LY_ERR err,LY_VECODE vecode,char *data_path,
                char *schema_path,uint64_t line,char *apptag,char *format,__va_list_tag *args)

{
  ly_err_item *plVar1;
  ly_err_item *plVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  char *pcVar6;
  ly_ctx_err_rec *plVar7;
  ly_err_item *plVar8;
  byte bVar9;
  ulong uVar10;
  char *__s;
  char *local_50;
  char *local_48;
  ulong local_40;
  char *local_38;
  
  local_50 = (char *)0x0;
  lVar5 = __tls_get_addr(&PTR_001fffa0);
  uVar10 = ly_log_opts;
  if (*(uint **)(lVar5 + 0x240) != (uint *)0x0) {
    uVar10 = (ulong)**(uint **)(lVar5 + 0x240);
  }
  if (level <= ly_ll) {
    local_40 = uVar10;
    if (err == LY_EMEM) {
      vsnprintf((char *)(lVar5 + 0x40),0x200,format,args);
      pcVar6 = (char *)0x0;
      __s = (char *)(lVar5 + 0x40);
    }
    else {
      iVar3 = vasprintf(&local_50,format,args);
      pcVar6 = local_50;
      if (iVar3 == -1) {
        ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","log_vprintf");
        goto LAB_00110692;
      }
      strncpy((char *)(lVar5 + 0x40),local_50,0x1ff);
      __s = pcVar6;
    }
    bVar9 = (pcVar6 != (char *)0x0 && (ctx != (ly_ctx *)0x0 && level < LY_LLVRB)) &
            (byte)(uVar10 >> 1) & 0x7f;
    if (bVar9 == 1) {
      local_48 = pcVar6;
      local_38 = __s;
      if (apptag == (char *)0x0) {
        pcVar6 = (char *)0x0;
      }
      else {
        pcVar6 = strdup(apptag);
      }
      plVar7 = ly_err_get_rec(ctx);
      if ((plVar7 == (ly_ctx_err_rec *)0x0) &&
         (plVar7 = ly_err_new_rec(ctx), plVar7 == (ly_ctx_err_rec *)0x0)) {
LAB_001108f8:
        ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","log_store");
        free(local_48);
        free(data_path);
        free(schema_path);
        goto LAB_001106aa;
      }
      plVar1 = plVar7->err;
      if (plVar1 == (ly_err_item *)0x0) {
        plVar8 = (ly_err_item *)calloc(1,0x48);
        if (plVar8 == (ly_err_item *)0x0) goto LAB_001108f8;
        plVar8->prev = plVar8;
        plVar8->next = (ly_err_item *)0x0;
        plVar7->err = plVar8;
      }
      else {
        if (*(uint **)(lVar5 + 0x240) == (uint *)0x0) {
          uVar4 = (uint)ly_log_opts;
        }
        else {
          uVar4 = **(uint **)(lVar5 + 0x240);
        }
        if ((~uVar4 & 6) == 0) {
          free(plVar1->msg);
          free(plVar1->data_path);
          free(plVar1->schema_path);
          free(plVar1->apptag);
          plVar8 = plVar1;
        }
        else {
          plVar2 = plVar1->prev;
          plVar8 = (ly_err_item *)calloc(1,0x48);
          plVar1->prev = plVar8;
          if (plVar8 == (ly_err_item *)0x0) goto LAB_001108f8;
          plVar8->prev = plVar2;
          plVar8->next = (ly_err_item *)0x0;
          plVar2->next = plVar8;
        }
      }
      plVar8->level = level;
      plVar8->err = err;
      plVar8->vecode = vecode;
      plVar8->msg = local_48;
      plVar8->data_path = data_path;
      plVar8->schema_path = schema_path;
      plVar8->line = line;
      plVar8->apptag = pcVar6;
      __s = local_38;
      if ((local_40 & 1) == 0) {
        return;
      }
    }
    else if ((local_40 & 1) == 0) goto LAB_00110692;
    if (log_clb == (ly_log_clb)0x0) {
      fprintf(_stderr,"libyang[%d]: ",(ulong)level);
      fputs(__s,_stderr);
      log_stderr_path_line(data_path,schema_path,line);
    }
    else {
      (*log_clb)(level,__s,data_path,schema_path,line);
    }
    if (bVar9 != 0) {
      return;
    }
  }
LAB_00110692:
  free(data_path);
  free(schema_path);
  pcVar6 = local_50;
LAB_001106aa:
  free(pcVar6);
  return;
}

Assistant:

static void
log_vprintf(const struct ly_ctx *ctx, LY_LOG_LEVEL level, LY_ERR err, LY_VECODE vecode, char *data_path,
        char *schema_path, uint64_t line, const char *apptag, const char *format, va_list args)
{
    char *dyn_msg = NULL;
    const char *msg;
    ly_bool free_strs = 1, lolog, lostore;

    /* learn effective logger options */
    if (temp_ly_log_opts) {
        lolog = *temp_ly_log_opts & LY_LOLOG;
        lostore = *temp_ly_log_opts & LY_LOSTORE;
    } else {
        lolog = ATOMIC_LOAD_RELAXED(ly_log_opts) & LY_LOLOG;
        lostore = ATOMIC_LOAD_RELAXED(ly_log_opts) & LY_LOSTORE;
    }

    if (level > ATOMIC_LOAD_RELAXED(ly_ll)) {
        /* do not print or store the message */
        goto cleanup;
    }

    if (err == LY_EMEM) {
        /* no not use more dynamic memory */
        vsnprintf(last_msg, LY_LAST_MSG_SIZE, format, args);
        msg = last_msg;
    } else {
        /* print into a single message */
        if (vasprintf(&dyn_msg, format, args) == -1) {
            LOGMEM(ctx);
            goto cleanup;
        }
        msg = dyn_msg;

        /* store as the last message */
        strncpy(last_msg, msg, LY_LAST_MSG_SIZE - 1);
    }

    /* store the error/warning in the context (if we need to store errors internally, it does not matter what are
     * the user log options), if the message is not dynamic, it would most likely fail to store (no memory) */
    if ((level < LY_LLVRB) && ctx && lostore && dyn_msg) {
        free_strs = 0;
        if (log_store(ctx, level, err, vecode, dyn_msg, data_path, schema_path, line, apptag ? strdup(apptag) : NULL)) {
            goto cleanup;
        }
    }

    /* if we are only storing errors internally, never print the message (yet) */
    if (lolog) {
        if (log_clb) {
            log_clb(level, msg, data_path, schema_path, line);
        } else {
            fprintf(stderr, "libyang[%d]: ", level);
            fprintf(stderr, "%s", msg);
            log_stderr_path_line(data_path, schema_path, line);
        }
    }

cleanup:
    if (free_strs) {
        free(data_path);
        free(schema_path);
        free(dyn_msg);
    }
}